

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlc.c
# Opt level: O3

void osqp_start_interrupt_listener(void)

{
  sigaction act;
  sigaction local_a0;
  
  int_detected = 0;
  local_a0.sa_flags = 0;
  sigemptyset(&local_a0.sa_mask);
  local_a0.__sigaction_handler.sa_handler = handle_ctrlc;
  sigaction(2,&local_a0,(sigaction *)&oact);
  return;
}

Assistant:

void osqp_start_interrupt_listener(void) {
  struct sigaction act;

  int_detected = 0;
  act.sa_flags = 0;
  sigemptyset(&act.sa_mask);
  act.sa_handler = handle_ctrlc;
  sigaction(SIGINT, &act, &oact);
}